

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm.h
# Opt level: O0

bool __thiscall GF2::MM<6UL>::IsDivide(MM<6UL> *this,MM<6UL> *mRight)

{
  ulong uVar1;
  bool bVar2;
  word wVar3;
  WW<6UL> *in_RSI;
  ulong *in_RDI;
  size_t pos;
  
  bVar2 = false;
  while( true ) {
    if (bVar2) {
      return true;
    }
    uVar1 = *in_RDI;
    wVar3 = WW<6UL>::GetWord(in_RSI,0);
    if ((uVar1 & (wVar3 ^ 0xffffffffffffffff)) != 0) break;
    bVar2 = true;
  }
  return false;
}

Assistant:

bool IsDivide(const MM& mRight) const
	{	
		for (size_t pos = 0; pos < _wcount; ++pos)
			if (_words[pos] & ~mRight.GetWord(pos))
				return false;
		return true;
	}